

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O0

void P_AddSectorLinksByID(sector_t_conflict *control,int id,INTBOOL ceiling)

{
  uint uVar1;
  int iVar2;
  FLineIdIterator local_48;
  uint local_3c;
  int movetype;
  line_t_conflict *ld;
  int line;
  FLineIdIterator itr;
  plane *scrollplane;
  INTBOOL ceiling_local;
  int id_local;
  sector_t_conflict *control_local;
  
  if (ceiling == 0) {
    local_48 = (FLineIdIterator)&control->e->Linked;
  }
  else {
    local_48 = (FLineIdIterator)&(control->e->Linked).Ceiling;
  }
  itr = local_48;
  FLineIdIterator::FLineIdIterator((FLineIdIterator *)&stack0xffffffffffffffd8,id);
  while (iVar2 = FLineIdIterator::Next((FLineIdIterator *)&stack0xffffffffffffffd8), -1 < iVar2) {
    if ((lines[iVar2].special == 0xbe) && (lines[iVar2].args[1] == 3)) {
      local_3c = lines[iVar2].args[3];
      if (lines[iVar2].frontsector == control) {
        if (ceiling == 0) {
          local_3c = local_3c & 0xfffffffe;
        }
        else {
          local_3c = local_3c & 0xfffffffd;
        }
      }
      uVar1 = local_3c & 0xf;
      if ((local_3c & 5) == 4) {
        uVar1 = local_3c & 0xb;
      }
      local_3c = uVar1;
      if ((local_3c & 10) == 8) {
        local_3c = local_3c & 0xfffffff7;
      }
      if ((local_3c != 0) && (lines[iVar2].frontsector != (sector_t_conflict *)0x0)) {
        AddSingleSector((plane *)itr,lines[iVar2].frontsector,local_3c);
      }
    }
  }
  return;
}

Assistant:

void P_AddSectorLinksByID(sector_t *control, int id, INTBOOL ceiling)
{
	extsector_t::linked::plane &scrollplane = ceiling? control->e->Linked.Ceiling : control->e->Linked.Floor;

	FLineIdIterator itr(id);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		line_t *ld = &lines[line];

		if (ld->special == Static_Init && ld->args[1] == Init_SectorLink)
		{
			int movetype = ld->args[3];

			// [GZ] Eternity does allow the attached sector to be the control sector, 
			// this permits elevator effects (ceiling attached to floors), so instead
			// of checking whether the two sectors are the same, we prevent a plane
			// from being attached to itself. This should be enough to do the trick.
			if (ld->frontsector == control)
			{
				if (ceiling)	movetype &= ~LINK_CEILING;
				else			movetype &= ~LINK_FLOOR;
			}

			// Make sure we have only valid combinations
			movetype &= LINK_FLAGMASK;
			if ((movetype & LINK_FLOORMIRROR) == LINK_FLOORMIRRORFLAG) movetype &= ~LINK_FLOORMIRRORFLAG;
			if ((movetype & LINK_CEILINGMIRROR) == LINK_CEILINGMIRRORFLAG) movetype &= ~LINK_CEILINGMIRRORFLAG;

			if (movetype != 0 && ld->frontsector != NULL)//&& ld->frontsector != control) Needs to be allowed!
			{
				AddSingleSector(scrollplane, ld->frontsector, movetype);
			}
		}
	}
}